

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

string * __thiscall BCLog::Logger::LogLevelsString_abi_cxx11_(Logger *this)

{
  Level *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  array<BCLog::Level,_3UL> *levels;
  allocator<BCLog::Level> *in_stack_ffffffffffffff58;
  string *this_00;
  allocator_type *in_stack_ffffffffffffff90;
  Level *in_stack_ffffffffffffff98;
  vector<BCLog::Level,_std::allocator<BCLog::Level>_> *this_01;
  undefined1 local_40 [24];
  _Type local_28;
  vector<BCLog::Level,_std::allocator<BCLog::Level>_> local_18;
  
  local_18.super__Vector_base<BCLog::Level,_std::allocator<BCLog::Level>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  local_28 = (_Type)LogLevelsList();
  local_18.super__Vector_base<BCLog::Level,_std::allocator<BCLog::Level>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = local_28[2];
  local_18.super__Vector_base<BCLog::Level,_std::allocator<BCLog::Level>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_28._0_8_;
  this_01 = &local_18;
  std::array<BCLog::Level,_3UL>::begin((array<BCLog::Level,_3UL> *)in_stack_ffffffffffffff58);
  std::array<BCLog::Level,_3UL>::end((array<BCLog::Level,_3UL> *)in_stack_ffffffffffffff58);
  std::allocator<BCLog::Level>::allocator(in_stack_ffffffffffffff58);
  std::vector<BCLog::Level,std::allocator<BCLog::Level>>::vector<BCLog::Level_const*,void>
            (this_01,in_RSI,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  util::
  Join<std::vector<BCLog::Level,std::allocator<BCLog::Level>>,char[3],BCLog::Logger::LogLevelsString[abi:cxx11]()const::__0>
            (this_00,local_40,", ");
  std::vector<BCLog::Level,_std::allocator<BCLog::Level>_>::~vector
            ((vector<BCLog::Level,_std::allocator<BCLog::Level>_> *)this_00);
  std::allocator<BCLog::Level>::~allocator(in_stack_ffffffffffffff58);
  if (*(pointer *)(in_FS_OFFSET + 0x28) ==
      local_18.super__Vector_base<BCLog::Level,_std::allocator<BCLog::Level>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string BCLog::Logger::LogLevelsString() const
{
    const auto& levels = LogLevelsList();
    return Join(std::vector<BCLog::Level>{levels.begin(), levels.end()}, ", ", [](BCLog::Level level) { return LogLevelToStr(level); });
}